

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

size_t __thiscall
pugi::xpath_query::evaluate_string(xpath_query *this,char_t *buffer,size_t capacity,xpath_node *n)

{
  bad_alloc *this_00;
  size_t sVar1;
  ulong uVar2;
  char_t *__src;
  ulong local_2108;
  size_t size;
  size_t full_size;
  undefined1 local_20c8 [8];
  xpath_string r;
  xpath_stack_data sd;
  xpath_context c;
  xpath_node *n_local;
  size_t capacity_local;
  char_t *buffer_local;
  xpath_query *this_local;
  
  impl::anon_unknown_0::xpath_context::xpath_context((xpath_context *)&sd.oom,n,1,1);
  impl::anon_unknown_0::xpath_stack_data::xpath_stack_data((xpath_stack_data *)&r._length_heap);
  if (this->_impl == (void *)0x0) {
    impl::anon_unknown_0::xpath_string::xpath_string((xpath_string *)local_20c8);
  }
  else {
    impl::anon_unknown_0::xpath_ast_node::eval_string
              ((xpath_string *)local_20c8,*this->_impl,(xpath_context *)&sd.oom,
               (xpath_stack *)&sd.temp._error);
  }
  if (((byte)sd.stack.temp & 1) != 0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  sVar1 = impl::anon_unknown_0::xpath_string::length((xpath_string *)local_20c8);
  uVar2 = sVar1 + 1;
  if (capacity != 0) {
    local_2108 = capacity;
    if (uVar2 < capacity) {
      local_2108 = uVar2;
    }
    if (local_2108 == 0) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                    ,0x32ff,
                    "size_t pugi::xpath_query::evaluate_string(char_t *, size_t, const xpath_node &) const"
                   );
    }
    __src = impl::anon_unknown_0::xpath_string::c_str((xpath_string *)local_20c8);
    memcpy(buffer,__src,local_2108 - 1);
    buffer[local_2108 - 1] = '\0';
  }
  impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data((xpath_stack_data *)&r._length_heap);
  return uVar2;
}

Assistant:

PUGI_IMPL_FN size_t xpath_query::evaluate_string(char_t* buffer, size_t capacity, const xpath_node& n) const
	{
		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_string r = _impl ? static_cast<impl::xpath_query_impl*>(_impl)->root->eval_string(c, sd.stack) : impl::xpath_string();

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			r = impl::xpath_string();
		#else
			throw std::bad_alloc();
		#endif
		}

		size_t full_size = r.length() + 1;

		if (capacity > 0)
		{
			size_t size = (full_size < capacity) ? full_size : capacity;
			assert(size > 0);

			memcpy(buffer, r.c_str(), (size - 1) * sizeof(char_t));
			buffer[size - 1] = 0;
		}

		return full_size;
	}